

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int findreplaceengine(bstring b,bstring find,bstring repl,int pos,instr_fnptr instr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  void *__dest;
  int l;
  int s;
  int *t;
  bstring ptStack_f0;
  int sl;
  bstring auxr;
  bstring auxf;
  ptrdiff_t pd;
  int static_d [32];
  int *d;
  int acc;
  int delta;
  int mlen;
  int slen;
  int ret;
  int i;
  instr_fnptr instr_local;
  int pos_local;
  bstring repl_local;
  bstring find_local;
  bstring b_local;
  
  if ((((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (find == (bstring)0x0)) ||
       ((find->data == (uchar *)0x0 || (repl == (bstring)0x0)))) ||
      ((repl->data == (uchar *)0x0 || ((pos < 0 || (find->slen < 1)))))) ||
     ((b->mlen < 0 ||
      ((((b->mlen < b->slen || (b->mlen < 1)) || (b->slen < 0)) || (repl->slen < 0)))))) {
    b_local._4_4_ = -1;
  }
  else if (b->slen - find->slen < pos) {
    b_local._4_4_ = 0;
  }
  else {
    lVar4 = (long)find->data - (long)b->data;
    auxr = find;
    if (((pos - find->slen < lVar4) && (lVar4 < b->slen)) &&
       (auxr = bstrcpy(find), auxr == (bstring)0x0)) {
      b_local._4_4_ = -1;
    }
    else {
      lVar4 = (long)repl->data - (long)b->data;
      ptStack_f0 = repl;
      if (((pos - repl->slen < lVar4) && (lVar4 < b->slen)) &&
         (ptStack_f0 = bstrcpy(repl), ptStack_f0 == (bstring)0x0)) {
        if (auxr != find) {
          bdestroy(auxr);
        }
        b_local._4_4_ = -1;
      }
      else {
        iVar1 = auxr->slen - ptStack_f0->slen;
        instr_local._4_4_ = pos;
        if (iVar1 == 0) {
          while (iVar1 = (*instr)(b,instr_local._4_4_,auxr), -1 < iVar1) {
            memcpy(b->data + iVar1,ptStack_f0->data,(long)ptStack_f0->slen);
            instr_local._4_4_ = auxr->slen + iVar1;
          }
          if (auxr != find) {
            bdestroy(auxr);
          }
          if (ptStack_f0 != repl) {
            bdestroy(ptStack_f0);
          }
          b_local._4_4_ = 0;
        }
        else if (iVar1 < 1) {
          acc = 0x20;
          static_d._120_8_ = &pd;
          delta = 0;
          d._0_4_ = 0;
          do {
            iVar2 = (*instr)(b,instr_local._4_4_,auxr);
            if (iVar2 < 0) {
              *(int *)(static_d._120_8_ + (long)delta * 4) = b->slen;
              mlen = balloc(b,b->slen + (int)d + 1);
              if (mlen == 0) {
                b->slen = (int)d + b->slen;
                while (slen = delta + -1, -1 < slen) {
                  iVar2 = *(int *)(static_d._120_8_ + (long)slen * 4) + auxr->slen;
                  iVar3 = *(int *)(static_d._120_8_ + (long)delta * 4) - iVar2;
                  if (iVar3 != 0) {
                    memmove(b->data + (long)(int)d + (long)iVar2,b->data + iVar2,(long)iVar3);
                  }
                  if (ptStack_f0->slen != 0) {
                    memmove(b->data + (((long)(int)d + (long)iVar2) - (long)ptStack_f0->slen),
                            ptStack_f0->data,(long)ptStack_f0->slen);
                  }
                  d._0_4_ = iVar1 + (int)d;
                  delta = slen;
                }
                b->data[b->slen] = '\0';
              }
              goto LAB_00127eb9;
            }
            __dest = (void *)static_d._120_8_;
            if (acc <= delta + 1) {
              iVar3 = acc * 2;
              if (&pd == (ptrdiff_t *)static_d._120_8_) {
                static_d[0x1e] = 0;
                static_d[0x1f] = 0;
              }
              if ((acc << 4 < iVar3) ||
                 (__dest = realloc((void *)static_d._120_8_,(long)(acc << 4)), __dest == (void *)0x0
                 )) {
                mlen = -1;
                goto LAB_00127eb9;
              }
              acc = iVar3;
              if (static_d._120_8_ == 0) {
                memcpy(__dest,&pd,0x80);
              }
            }
            static_d._120_8_ = __dest;
            *(int *)(static_d._120_8_ + (long)delta * 4) = iVar2;
            delta = delta + 1;
            d._0_4_ = (int)d - iVar1;
            instr_local._4_4_ = auxr->slen + iVar2;
          } while ((-1 < instr_local._4_4_) && (-1 < (int)d));
          mlen = -1;
LAB_00127eb9:
          if (&pd == (ptrdiff_t *)static_d._120_8_) {
            static_d[0x1e] = 0;
            static_d[0x1f] = 0;
          }
          free((void *)static_d._120_8_);
          if (auxr != find) {
            bdestroy(auxr);
          }
          if (ptStack_f0 != repl) {
            bdestroy(ptStack_f0);
          }
          b_local._4_4_ = mlen;
        }
        else {
          d._0_4_ = 0;
          while (iVar2 = (*instr)(b,instr_local._4_4_,auxr), -1 < iVar2) {
            if (((int)d != 0) && (instr_local._4_4_ < iVar2)) {
              memmove(b->data + ((long)instr_local._4_4_ - (long)(int)d),b->data + instr_local._4_4_
                      ,(long)(iVar2 - instr_local._4_4_));
            }
            if (ptStack_f0->slen != 0) {
              memcpy(b->data + ((long)iVar2 - (long)(int)d),ptStack_f0->data,(long)ptStack_f0->slen)
              ;
            }
            d._0_4_ = iVar1 + (int)d;
            instr_local._4_4_ = iVar2 + auxr->slen;
          }
          if ((int)d != 0) {
            if (instr_local._4_4_ < b->slen) {
              memmove(b->data + ((long)instr_local._4_4_ - (long)(int)d),b->data + instr_local._4_4_
                      ,(long)(b->slen - instr_local._4_4_));
            }
            b->slen = b->slen - (int)d;
            b->data[b->slen] = '\0';
          }
          if (auxr != find) {
            bdestroy(auxr);
          }
          if (ptStack_f0 != repl) {
            bdestroy(ptStack_f0);
          }
          b_local._4_4_ = 0;
        }
      }
    }
  }
  return b_local._4_4_;
}

Assistant:

static int findreplaceengine (bstring b, const bstring find, const bstring repl, int pos, instr_fnptr instr) {
int i, ret, slen, mlen, delta, acc;
int * d;
int static_d[32];
ptrdiff_t pd;
bstring auxf = find;
bstring auxr = repl;

	if (b == NULL || b->data == NULL || find == NULL ||
	    find->data == NULL || repl == NULL || repl->data == NULL || 
	    pos < 0 || find->slen <= 0 || b->mlen < 0 || b->slen > b->mlen || 
	    b->mlen <= 0 || b->slen < 0 || repl->slen < 0) return BSTR_ERR;
	if (pos > b->slen - find->slen) return 0;

	/* Alias with find string */
	pd = (ptrdiff_t) (find->data - b->data);
	if ((ptrdiff_t) (pos - find->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxf = bstrcpy (find))) return BSTR_ERR;
	}

	/* Alias with repl string */
	pd = (ptrdiff_t) (repl->data - b->data);
	if ((ptrdiff_t) (pos - repl->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxr = bstrcpy (repl))) {
			if (auxf != find) bdestroy (auxf);
			return BSTR_ERR;
		}
	}

	delta = auxf->slen - auxr->slen;

	/* in-place replacement since find and replace strings are of equal 
	   length */
	if (delta == 0) {
		while ((pos = instr (b, pos, auxf)) >= 0) {
			bstr__memcpy (b->data + pos, auxr->data, auxr->slen);
			pos += auxf->slen;
		}
		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return 0;
	}

	/* shrinking replacement since auxf->slen > auxr->slen */
	if (delta > 0) {
		acc = 0;

		while ((i = instr (b, pos, auxf)) >= 0) {
			if (acc && i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			if (auxr->slen)
				bstr__memcpy (b->data + i - acc, auxr->data, auxr->slen);
			acc += delta;
			pos = i + auxf->slen;
		}

		if (acc) {
			i = b->slen;
			if (i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			b->slen -= acc;
			b->data[b->slen] = (unsigned char) '\0';
		}

		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return 0;
	}

	/* expanding replacement since find->slen < repl->slen.  Its a lot 
	   more complicated. */

	mlen = 32;
	d = (int *) static_d; /* Avoid malloc for trivial cases */
	acc = slen = 0;

	while ((pos = instr (b, pos, auxf)) >= 0) {
		if (slen + 1 >= mlen) {
			int sl;
			int * t;
			mlen += mlen;
			sl = sizeof (int *) * mlen;
			if (static_d == d) d = NULL;
			if (sl < mlen || NULL == (t = (int *) bstr__realloc (d, sl))) {
				ret = BSTR_ERR;
				goto done;
			}
			if (NULL == d) bstr__memcpy (t, static_d, sizeof (static_d));
			d = t;
		}
		d[slen] = pos;
		slen++;
		acc -= delta;
		pos += auxf->slen;
		if (pos < 0 || acc < 0) {
			ret = BSTR_ERR;
			goto done;
		}
	}
	d[slen] = b->slen;

	if (BSTR_OK == (ret = balloc (b, b->slen + acc + 1))) {
		b->slen += acc;
		for (i = slen-1; i >= 0; i--) {
			int s, l;
			s = d[i] + auxf->slen;
			l = d[i+1] - s;
			if (l) {
				bstr__memmove (b->data + s + acc, b->data + s, l);
			}
			if (auxr->slen) {
				bstr__memmove (b->data + s + acc - auxr->slen, 
				         auxr->data, auxr->slen);
			}
			acc += delta;		
		}
		b->data[b->slen] = (unsigned char) '\0';
	}

	done:;
	if (static_d == d) d = NULL;
	bstr__free (d);
	if (auxf != find) bdestroy (auxf);
	if (auxr != repl) bdestroy (auxr);
	return ret;
}